

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

void de_cleanup(dohentry *d)

{
  dohentry *s;
  long lVar1;
  
  s = d;
  for (lVar1 = 0; lVar1 < d->numcname; lVar1 = lVar1 + 1) {
    Curl_dyn_free(s->cname);
    s = (dohentry *)(s->cname + 1);
  }
  return;
}

Assistant:

UNITTEST void de_cleanup(struct dohentry *d)
{
  int i = 0;
  for(i = 0; i < d->numcname; i++) {
    Curl_dyn_free(&d->cname[i]);
  }
#ifdef USE_HTTPSRR
  for(i = 0; i < d->numhttps_rrs; i++)
    Curl_safefree(d->https_rrs[i].val);
#endif
}